

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void __thiscall OPL::DOSBox::DBOPL::Operator::UpdateRelease(Operator *this,Chip *chip)

{
  byte bVar1;
  
  bVar1 = this->reg80 & 0xf;
  if (bVar1 == 0) {
    bVar1 = this->rateZero;
    this->rateZero = bVar1 | 2;
    this->releaseAdd = 0;
    if ((this->reg20 & 0x20) != 0) {
      return;
    }
    bVar1 = bVar1 | 6;
  }
  else {
    this->releaseAdd = chip->linearRates[(byte)(bVar1 * '\x04' + this->ksr)];
    bVar1 = this->rateZero;
    this->rateZero = bVar1 & 0xfd;
    if ((this->reg20 & 0x20) != 0) {
      return;
    }
    bVar1 = bVar1 & 0xf9;
  }
  this->rateZero = bVar1;
  return;
}

Assistant:

inline void Operator::UpdateRelease( const Chip* chip ) {
	Bit8u rate = reg80 & 0xf;
	if ( rate ) {
		Bit8u val = (rate << 2) + ksr;
		releaseAdd = chip->linearRates[ val ];
		rateZero &= ~(1 << RELEASE);
		if ( !(reg20 & MASK_SUSTAIN ) ) {
			rateZero &= ~( 1 << SUSTAIN );
		}
	} else {
		rateZero |= (1 << RELEASE);
		releaseAdd = 0;
		if ( !(reg20 & MASK_SUSTAIN ) ) {
			rateZero |= ( 1 << SUSTAIN );
		}
	}
}